

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackNSISGenerator::CreateDeselectionDependenciesDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponent *component,
          set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
          *visited)

{
  pointer ppcVar1;
  cmCPackComponent *component_00;
  size_type sVar2;
  ostream *poVar3;
  pointer ppcVar4;
  ostringstream out;
  cmCPackComponent *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  local_1d0 = component;
  sVar2 = std::
          set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
          ::count(visited,&local_1d0);
  if (sVar2 == 0) {
    std::
    _Rb_tree<cmCPackComponent*,cmCPackComponent*,std::_Identity<cmCPackComponent*>,std::less<cmCPackComponent*>,std::allocator<cmCPackComponent*>>
    ::_M_insert_unique<cmCPackComponent*const&>
              ((_Rb_tree<cmCPackComponent*,cmCPackComponent*,std::_Identity<cmCPackComponent*>,std::less<cmCPackComponent*>,std::allocator<cmCPackComponent*>>
                *)visited,&local_1d0);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    ppcVar1 = (local_1d0->ReverseDependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar4 = (local_1d0->ReverseDependencies).
                   super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
        ppcVar4 = ppcVar4 + 1) {
      component_00 = *ppcVar4;
      poVar3 = std::operator<<((ostream *)local_1a8,"  SectionGetFlags ${");
      poVar3 = std::operator<<(poVar3,(string *)component_00);
      std::operator<<(poVar3,"} $0\n");
      std::operator<<((ostream *)local_1a8,"  IntOp $1 ${SF_SELECTED} ~\n");
      std::operator<<((ostream *)local_1a8,"  IntOp $0 $0 & $1\n");
      poVar3 = std::operator<<((ostream *)local_1a8,"  SectionSetFlags ${");
      poVar3 = std::operator<<(poVar3,(string *)component_00);
      std::operator<<(poVar3,"} $0\n");
      poVar3 = std::operator<<((ostream *)local_1a8,"  IntOp $");
      poVar3 = std::operator<<(poVar3,(string *)component_00);
      std::operator<<(poVar3,"_selected 0 + 0\n");
      CreateDeselectionDependenciesDescription_abi_cxx11_(&local_1c8,this,component_00,visited);
      std::operator<<((ostream *)local_1a8,local_1c8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateDeselectionDependenciesDescription(
  cmCPackComponent* component, std::set<cmCPackComponent*>& visited)
{
  // Don't visit a component twice
  if (visited.count(component)) {
    return {};
  }
  visited.insert(component);

  std::ostringstream out;
  for (cmCPackComponent* depend : component->ReverseDependencies) {
    // Write NSIS code to deselect this dependency
    out << "  SectionGetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $1 ${SF_SELECTED} ~\n";
    out << "  IntOp $0 $0 & $1\n";
    out << "  SectionSetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $" << depend->Name << "_selected 0 + 0\n";

    // Recurse
    out << this->CreateDeselectionDependenciesDescription(depend, visited)
             .c_str();
  }

  return out.str();
}